

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O3

void __thiscall helics::FirewallOperator::~FirewallOperator(FirewallOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__FirewallOperator_004c0e00;
  p_Var1 = (this->checkFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->checkFunction,(_Any_data *)&this->checkFunction,__destroy_functor)
    ;
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

class HELICS_CXX_EXPORT FirewallOperator: public FilterOperator {
  public:
    /** enumeration of the possible operations of the firewall*/
    enum class operations : int {
        none = -1,
        drop = 0,
        pass = 1,
        set_flag1 = 2,
        set_flag2 = 3,
        set_flag3 = 4
    };
    /** default constructor*/
    FirewallOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit FirewallOperator(std::function<bool(const Message*)> userCheckFunction);
    /** set the function to modify the data of the message*/
    void setCheckFunction(std::function<bool(const Message*)> userCheckFunction);
    /** set the operation to perform on positive checkFunction*/
    void setOperation(operations newop) { operation.store(newop); }

  private:
    std::function<bool(const Message*)>
        checkFunction;  //!< the function actually doing the processing
    std::atomic<operations> operation{
        operations::drop};  //!< the operation to perform if the firewall triggers
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}